

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::NegativeCompileErrors::Run(NegativeCompileErrors *this)

{
  bool bVar1;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  NegativeCompileErrors *local_18;
  NegativeCompileErrors *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\nlayout(rgba32f) writeonly readonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
             ,&local_39);
  bVar1 = Compile(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "\nlayout(rgba32f) writeonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
               ,&local_71);
    bVar1 = Compile(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 "\nuniform vec4 i_color;\nlayout(rgba32f) readonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec2(0), i_color);\n  o_color = i_color;\n}"
                 ,&local_99);
      bVar1 = Compile(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "\nuniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
                   ,&local_c1);
        bVar1 = Compile(this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,
                     "\nreadonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
                     ,&local_e9);
          bVar1 = Compile(this,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_110,
                       "\nlayout(r32i) uniform image1D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = vec4(1.0);\n}"
                       ,&local_111);
            bVar1 = Compile(this,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            std::allocator<char>::~allocator(&local_111);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_138,
                         "\nlayout(rgba16) writeonly uniform iimage2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = vec4(1.0);\n}"
                         ,&local_139);
              bVar1 = Compile(this,&local_138);
              std::__cxx11::string::~string((string *)&local_138);
              std::allocator<char>::~allocator(&local_139);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_160,
                           "\n#extension GL_OES_shader_image_atomic : require\nlayout(r32f) coherent uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageAtomicAdd(g_image, ivec2(1), 10);\n  o_color = vec4(1.0);\n}"
                           ,&local_161);
                bVar1 = Compile(this,&local_160);
                std::__cxx11::string::~string((string *)&local_160);
                std::allocator<char>::~allocator(&local_161);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,
                             "\n#extension GL_OES_shader_image_atomic : require\nlayout(rgba8i) coherent uniform iimage2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageAtomicAdd(g_image, ivec2(1), 1);\n  o_color = vec4(1.0);\n}"
                             ,&local_189);
                  bVar1 = Compile(this,&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::allocator<char>::~allocator(&local_189);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1b0,
                               "\nlayout(r32ui) uniform iimage3D g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec3(1), ivec4(1));\n  o_color = vec4(1.0);\n}"
                               ,&local_1b1);
                    bVar1 = Compile(this,&local_1b0);
                    std::__cxx11::string::~string((string *)&local_1b0);
                    std::allocator<char>::~allocator(&local_1b1);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1d8,
                                 "\nlayout(r32f) uniform uimage2DArray g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec3(0), uvec4(1));\n  o_color = vec4(1.0);\n}"
                                 ,&local_1d9);
                      bVar1 = Compile(this,&local_1d8);
                      std::__cxx11::string::~string((string *)&local_1d8);
                      std::allocator<char>::~allocator(&local_1d9);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_200,
                                   "\nlayout(r32f) coherent uniform image2D g_image;\nvec4 Load(iimage2D image) {\n  return imageLoad(image, vec2(0));\n}\nvoid main() {\n  vec4 o_color;\n  o_color = Load(g_image);\n}"
                                   ,&local_201);
                        bVar1 = Compile(this,&local_200);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::allocator<char>::~allocator(&local_201);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          this_local = (NegativeCompileErrors *)0x0;
                        }
                        else {
                          this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeCompileErrors *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!Compile( // writeonly & readonly qualifiers
				NL "layout(rgba32f) writeonly readonly uniform image2D g_image;" NL "void main() {" NL
				   "  vec4 o_color;" NL "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // writeonly && reading
				NL "layout(rgba32f) writeonly uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( //readonly && writing
				NL "uniform vec4 i_color;" NL "layout(rgba32f) readonly uniform image2D g_image;" NL "void main() {" NL
				   "  vec4 o_color;" NL "  imageStore(g_image, ivec2(0), i_color);" NL "  o_color = i_color;" NL "}"))
			return ERROR;

		if (!Compile( // no format layout && load
				NL "uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // no fromat layout && readonly && load
				NL "readonly uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // target type image1D not supported
				NL "layout(r32i) uniform image1D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(rgba16) writeonly uniform iimage2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // imageAtomicAdd doesn't support r32f
				NL "#extension GL_OES_shader_image_atomic : require" NL
				   "layout(r32f) coherent uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageAtomicAdd(g_image, ivec2(1), 10);" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // imageAtomicAdd doesn't support rgba8i
				NL "#extension GL_OES_shader_image_atomic : require" NL
				   "layout(rgba8i) coherent uniform iimage2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageAtomicAdd(g_image, ivec2(1), 1);" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(r32ui) uniform iimage3D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageStore(g_image, ivec3(1), ivec4(1));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(r32f) uniform uimage2DArray g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageStore(g_image, ivec3(0), uvec4(1));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // wrong function argument type
				NL "layout(r32f) coherent uniform image2D g_image;" NL "vec4 Load(iimage2D image) {" NL
				   "  return imageLoad(image, vec2(0));" NL "}" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = Load(g_image);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}